

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_memory_object.h
# Opt level: O3

void __thiscall
SharedMemoryObject<pthread_cond_t>::~SharedMemoryObject(SharedMemoryObject<pthread_cond_t> *this)

{
  int iVar1;
  ContextManager *pCVar2;
  string local_30;
  
  iVar1 = free_shared_memory(this->ptr_,0x30);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Cannot free shared memory at %p: %m",this->ptr_);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

~SharedMemoryObject() {
        if (free_shared_memory(ptr_, sizeof(T)) != 0) {
            die(format("Cannot free shared memory at %p: %m", ptr_));
        }
    }